

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall fixedPreciseMeasurement_cast_Test::TestBody(fixedPreciseMeasurement_cast_Test *this)

{
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, cast)
{
    fixed_precise_measurement m1(2.0, precise::m);
    auto m3 = measurement_cast(m1);

    auto m4 = measurement_cast(m3);
    static_assert(
        std::is_same<decltype(m3), fixed_measurement>::value,
        "measurement cast not working for fixed_precise_measurement");
    static_assert(
        std::is_same<decltype(m4), fixed_measurement>::value,
        "measurement cast not working for fixed_measurement");
}